

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag.c
# Opt level: O1

void Tags_delete(Tags *tags)

{
  long lVar1;
  long lVar2;
  
  if (tags != (Tags *)0x0) {
    if (tags->tags != (Tag *)0x0) {
      if (L'\0' < tags->tag_count) {
        lVar1 = 0;
        lVar2 = 0;
        do {
          delete_tag_content((Tag *)((long)&tags->tags->tag_delete + lVar1));
          lVar2 = lVar2 + 1;
          lVar1 = lVar1 + 0x28;
        } while (lVar2 < tags->tag_count);
      }
      free(tags->tags);
    }
    free(tags);
    return;
  }
  return;
}

Assistant:

void Tags_delete(const Tags* tags) {
    if (!tags) {
        return;
    }
    if (tags->tags) {
        int i;
        for(i = 0; i < tags->tag_count; ++i) {
            delete_tag_content(tags->tags + i);
        }
        free((void*)tags->tags);
    }
    free((void*)tags);
}